

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall
soul::StructuralParser::giveErrorOnAssignmentToProcessorProperty(StructuralParser *this)

{
  SourceCodeText *o;
  char *pcVar1;
  bool bVar2;
  Context context;
  Context local_98;
  CompileMessage local_80;
  CompileMessage local_48;
  
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_98.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_98.parentScope = this->currentScope;
  local_98.location.sourceCode.object = o;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27bb0c);
  if ((bVar2) &&
     ((pcVar1 = (this->super_SOULTokeniser).currentType.text, pcVar1 == "." ||
      (((pcVar1 != (char *)0x0 && (*pcVar1 == '.')) && (pcVar1[1] == '\0')))))) {
    parseProcessorProperty(this);
    pcVar1 = (this->super_SOULTokeniser).currentType.text;
    if ((pcVar1 != "=") && (((pcVar1 == (char *)0x0 || (*pcVar1 != '=')) || (pcVar1[1] != '\0')))) {
      CompileMessageHelpers::createMessage<>(&local_80,syntax,error,"Expected a statement");
      AST::Context::throwError(&local_98,&local_80,false);
    }
    CompileMessageHelpers::createMessage<>
              (&local_48,syntax,error,"Processor properties are constants, and cannot be modified");
    AST::Context::throwError(&local_98,&local_48,false);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return;
}

Assistant:

void giveErrorOnAssignmentToProcessorProperty()
    {
        auto context = getContext();

        if (matchIf (Keyword::processor) && matches (Operator::dot))
        {
            ignoreUnused (parseProcessorProperty());

            if (matches (Operator::assign))
                context.throwError (Errors::cannotAssignToProcessorProperties());

            context.throwError (Errors::expectedStatement());
        }
    }